

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * convolve_lowbd(__m256i *s,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i *in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i res;
  __m256i res_67;
  __m256i res_45;
  __m256i res_23;
  __m256i res_01;
  
  auVar1 = vpmaddubsw_avx2(*in_RDI,(undefined1  [32])*in_RSI);
  auVar2 = vpmaddubsw_avx2(in_RDI[1],(undefined1  [32])in_RSI[1]);
  auVar3 = vpmaddubsw_avx2(in_RDI[2],(undefined1  [32])in_RSI[2]);
  auVar4 = vpmaddubsw_avx2(in_RDI[3],(undefined1  [32])in_RSI[3]);
  auVar1 = vpaddw_avx2(auVar1,auVar3);
  auVar2 = vpaddw_avx2(auVar2,auVar4);
  vpaddw_avx2(auVar1,auVar2);
  return in_RSI;
}

Assistant:

static inline __m256i convolve_lowbd(const __m256i *const s,
                                     const __m256i *const coeffs) {
  const __m256i res_01 = _mm256_maddubs_epi16(s[0], coeffs[0]);
  const __m256i res_23 = _mm256_maddubs_epi16(s[1], coeffs[1]);
  const __m256i res_45 = _mm256_maddubs_epi16(s[2], coeffs[2]);
  const __m256i res_67 = _mm256_maddubs_epi16(s[3], coeffs[3]);

  // order: 0 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15
  const __m256i res = _mm256_add_epi16(_mm256_add_epi16(res_01, res_45),
                                       _mm256_add_epi16(res_23, res_67));

  return res;
}